

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureFilterMinmaxUtils::TextureCube::generate
          (TextureCube *this,RenderContext *context,IVec3 *size,GLenum format,GLenum type,
          bool generateMipmaps)

{
  MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TextureCube *this_01;
  long lVar4;
  int faceIndex;
  long lVar5;
  undefined1 local_50 [16];
  Vec4 local_40;
  long lVar3;
  
  iVar1 = (*context->_vptr_RenderContext[3])(context);
  lVar3 = CONCAT44(extraout_var,iVar1);
  this_01 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube(this_01,context,format,type,size->m_data[0]);
  local_50._0_8_ = (TextureCube *)0x0;
  this_00 = &this->m_texture;
  if ((this->m_texture).super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>.
      m_data.ptr != this_01) {
    de::details::UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::reset
              (&this_00->super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>);
    (this_00->super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>).m_data.ptr
         = this_01;
  }
  de::details::UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::reset
            ((UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *)local_50);
  lVar4 = 0xb0;
  lVar5 = 0;
  do {
    tcu::TextureCube::allocLevel
              (&((this_00->super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>
                 ).m_data.ptr)->m_refTexture,(CubeFace)lVar5,0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glu::TextureCube error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x1c3);
    local_50._0_8_ = &DAT_3f8000003f800000;
    local_50._8_8_ = &DAT_3f8000003f800000;
    local_40.m_data[0] = 0.0;
    local_40.m_data[1] = 0.0;
    local_40.m_data[2] = 0.0;
    local_40.m_data[3] = 1.0;
    tcu::fillWithGrid(*(PixelBufferAccess **)
                       ((long)(((this_00->
                                super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>
                                ).m_data.ptr)->m_refTexture).m_data + lVar4 + -0x20),4,
                      (Vec4 *)local_50,&local_40);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glu::TextureCube error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x1c7);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x18;
  } while (lVar5 != 6);
  glu::TextureCube::upload
            ((this_00->super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>).
             m_data.ptr);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glu::TextureCube error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x1cb);
  (**(code **)(lVar3 + 8))(0x84c0);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::TextureCube::generate(const glu::RenderContext& context, tcu::IVec3 size,
													 glw::GLenum format, glw::GLenum type, bool generateMipmaps)
{
	DE_UNREF(generateMipmaps);

	const glw::Functions& gl = context.getFunctions();

	m_texture = de::MovePtr<glu::TextureCube>(new glu::TextureCube(context, format, type, size.x()));

	for (int faceIndex = 0; faceIndex < tcu::CUBEFACE_LAST; ++faceIndex)
	{
		m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceIndex, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glu::TextureCube error occurred");

		tcu::fillWithGrid(m_texture->getRefTexture().getLevelFace(0, (tcu::CubeFace)faceIndex), 4,
						  tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glu::TextureCube error occurred");
	}

	m_texture->upload();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::TextureCube error occurred");

	gl.activeTexture(GL_TEXTURE0);
}